

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v7::detail::add_compare(bigint *lhs1,bigint *lhs2,bigint *rhs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  
  iVar2 = lhs1->exp_;
  iVar10 = (int)(lhs1->bigits_).super_buffer<unsigned_int>.size_ + iVar2;
  iVar3 = lhs2->exp_;
  iVar11 = (int)(lhs2->bigits_).super_buffer<unsigned_int>.size_ + iVar3;
  iVar14 = iVar11;
  if (iVar11 < iVar10) {
    iVar14 = iVar10;
  }
  uVar13 = (uint)(rhs->bigits_).super_buffer<unsigned_int>.size_;
  iVar4 = rhs->exp_;
  iVar1 = iVar4 + uVar13;
  if (iVar14 + 1 < iVar1) {
LAB_0024e546:
    iVar7 = -1;
  }
  else if (iVar1 < iVar14) {
LAB_0024e554:
    iVar7 = 1;
  }
  else {
    iVar14 = iVar2;
    if (iVar3 < iVar2) {
      iVar14 = iVar3;
    }
    if (iVar4 < iVar14) {
      iVar14 = iVar4;
    }
    iVar7 = 0;
    if (iVar14 < iVar1) {
      uVar12 = 0;
      do {
        uVar13 = uVar13 - 1;
        iVar7 = iVar4 + uVar13 + 1;
        if (iVar10 < iVar7 || iVar7 <= iVar2) {
          uVar6 = 0;
        }
        else {
          uVar5 = (iVar4 - iVar2) + uVar13;
          if ((int)uVar5 < 0) goto LAB_0024e679;
          uVar6 = (ulong)(lhs1->bigits_).super_buffer<unsigned_int>.ptr_[uVar5];
        }
        if (iVar11 < iVar7 || iVar7 <= iVar3) {
          uVar9 = 0;
        }
        else {
          uVar5 = (iVar4 - iVar3) + uVar13;
          if ((int)uVar5 < 0) goto LAB_0024e679;
          uVar9 = (ulong)(lhs2->bigits_).super_buffer<unsigned_int>.ptr_[uVar5];
        }
        if (iVar1 < iVar7 || iVar7 <= iVar4) {
          uVar8 = 0;
        }
        else {
          if ((int)uVar13 < 0) {
LAB_0024e679:
            assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/core.h"
                        ,0x13c,"negative value");
          }
          uVar8 = (ulong)(rhs->bigits_).super_buffer<unsigned_int>.ptr_[uVar13];
        }
        uVar8 = uVar8 | uVar12;
        uVar9 = uVar9 + uVar6;
        if (uVar8 < uVar9) goto LAB_0024e554;
        if (1 < uVar8 - uVar9) goto LAB_0024e546;
        uVar12 = uVar8 - uVar9 << 0x20;
      } while (iVar14 < (int)(iVar4 + uVar13));
      iVar7 = -(uint)(uVar8 != uVar9);
    }
  }
  return iVar7;
}

Assistant:

int add_compare(const bigint& lhs1, const bigint& lhs2,
                         const bigint& rhs) {
    int max_lhs_bigits = (std::max)(lhs1.num_bigits(), lhs2.num_bigits());
    int num_rhs_bigits = rhs.num_bigits();
    if (max_lhs_bigits + 1 < num_rhs_bigits) return -1;
    if (max_lhs_bigits > num_rhs_bigits) return 1;
    auto get_bigit = [](const bigint& n, int i) -> bigit {
      return i >= n.exp_ && i < n.num_bigits() ? n[i - n.exp_] : 0;
    };
    double_bigit borrow = 0;
    int min_exp = (std::min)((std::min)(lhs1.exp_, lhs2.exp_), rhs.exp_);
    for (int i = num_rhs_bigits - 1; i >= min_exp; --i) {
      double_bigit sum =
          static_cast<double_bigit>(get_bigit(lhs1, i)) + get_bigit(lhs2, i);
      bigit rhs_bigit = get_bigit(rhs, i);
      if (sum > rhs_bigit + borrow) return 1;
      borrow = rhs_bigit + borrow - sum;
      if (borrow > 1) return -1;
      borrow <<= bigit_bits;
    }
    return borrow != 0 ? -1 : 0;
  }